

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RsElseClauseSyntax::setChild
          (RsElseClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffffb8;
  RsProdItemSyntax *local_30;
  not_null<slang::syntax::RsProdItemSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffb8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x9da0ba);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (RsProdItemSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x9da0ca);
      local_30 = SyntaxNode::as<slang::syntax::RsProdItemSyntax>(pSVar1);
    }
    not_null<slang::syntax::RsProdItemSyntax_*>::not_null<slang::syntax::RsProdItemSyntax_*>
              (&local_28,&local_30);
    *(RsProdItemSyntax **)(in_RDI + 0x28) = local_28.ptr;
  }
  return;
}

Assistant:

void RsElseClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}